

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl_fileutils.c
# Opt level: O0

mcu8str * mctools_absolute_path(mcu8str *pathraw)

{
  int iVar1;
  mcu8str *in_RDI;
  mcu8str *in_stack_00000018;
  mcu8str *in_stack_00000020;
  mcu8str cwd;
  int not_done;
  mcu8str path;
  mcu8str *str;
  char *local_70;
  mcu8str *in_stack_ffffffffffffff98;
  undefined8 local_60;
  char *local_40;
  undefined8 local_38;
  undefined8 local_30;
  int local_18;
  
  str = in_RDI;
  mctools_impl_view_no_winnamespace(in_RDI);
  mcu8str_create_empty();
  if (local_18 != 0) {
    iVar1 = mctools_path_is_absolute(in_stack_ffffffffffffff98);
    if (iVar1 == 0) {
      mctools_get_current_working_dir();
      mctools_path_join(in_stack_00000020,in_stack_00000018);
      in_RDI->c_str = local_70;
      *(mcu8str **)&in_RDI->size = in_stack_ffffffffffffff98;
      *(undefined8 *)&in_RDI->owns_memory = local_60;
      mcu8str_dealloc(str);
    }
    else {
      mcu8str_copy(str);
      in_RDI->c_str = local_40;
      in_RDI->size = (undefined4)local_38;
      in_RDI->buflen = local_38._4_4_;
      *(undefined8 *)&in_RDI->owns_memory = local_30;
    }
    mctools_pathseps_platform(str);
  }
  return str;
}

Assistant:

mcu8str mctools_absolute_path( const mcu8str* pathraw )
  {
    mcu8str path = mctools_impl_view_no_winnamespace(pathraw);
    mcu8str res = mcu8str_create_empty();
    if ( path.size == 0 )
      return res;
#ifdef MC_IS_WINDOWS
    {
      mcwinstr wpath = mc_path2wpath( &path );
      res = mc_winstr_expand_to_fullpath_u8str( &wpath );
      mc_winstr_dealloc(&wpath);
    }
    const int not_done = (res.size == 0?1:0);
#else
    const int not_done = 1;
#endif
    if ( not_done ) {
      if ( mctools_path_is_absolute(&path) ) {
        res = mcu8str_copy( &path );
      } else {
        mcu8str cwd = mctools_get_current_working_dir();
        res = mctools_path_join( &cwd, &path );
        mcu8str_dealloc(&cwd);
      }
    }
    mctools_pathseps_platform(&res);
    return res;
  }